

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmGen7TextureCalc::FillTex2D
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GMM_RESOURCE_TYPE GVar5;
  anon_struct_8_45_9b07292e_for_Gpu aVar6;
  anon_struct_8_44_94931171_for_Info aVar7;
  GMM_PLATFORM_INFO *pGVar8;
  uint8_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int iVar12;
  GMM_STATUS GVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t CompressDepth;
  uint32_t ColFactor;
  uint32_t RowFactor;
  GMM_PLATFORM_INFO *local_68;
  uint local_60;
  uint local_5c;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  uint8_t local_31;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  _ColFactor = pRestrictions;
  local_68 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  GVar5 = pTexInfo->Type;
  CompressHeight = pTexInfo->BitsPerPixel;
  uVar11 = pTexInfo->BaseHeight;
  local_38 = (uint)pTexInfo->BaseWidth;
  uVar15 = (pTexInfo->MSAA).NumSamples;
  uVar15 = uVar15 + (uVar15 == 0);
  (pTexInfo->MSAA).NumSamples = uVar15;
  uVar16 = pTexInfo->ArraySize;
  aVar6 = (pTexInfo->Flags).Gpu;
  uVar10 = 1;
  if (((ulong)aVar6 & 0x20000040) == 0) {
    uVar10 = uVar15;
  }
  uVar14 = uVar10 * ((uint)(GVar5 == RESOURCE_CUBE) * 5 + 1) * (uVar16 + (uVar16 == 0));
  uVar17 = uVar14;
  if (((ulong)aVar6 & 0x18) == 0) goto LAB_001a47f3;
  if ((uVar14 == uVar16 && uVar14 < 3) &&
     ((pTexInfo->Format - GMM_FORMAT_B8G8R8A8_UNORM < 4 ||
      (pTexInfo->Format - GMM_FORMAT_R8G8B8A8_UNORM < 2)))) {
    if (((byte)(((ulong)aVar6 & 0xffffffff) >> 3) & 0x1f & (local_38 & 0xf) == 0) != 0) {
      uVar17 = 4;
      goto LAB_001a47f3;
    }
    if ((((ulong)aVar6 & 0x10) != 0) && (uVar17 = 4, local_38 % 0xc == 0)) goto LAB_001a47f3;
  }
  (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar6 & 0xffffffffffffffe7);
  uVar17 = uVar14;
LAB_001a47f3:
  local_48 = CONCAT44(local_48._4_4_,(pTexInfo->Alignment).HAlign);
  uVar15 = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_5c,&local_60,&local_7c);
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  if (uVar17 < 2) {
    uVar16 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[6])(this,pTexInfo);
  }
  else {
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
      uVar10 = 1;
    }
    else {
      uVar10 = (pTexInfo->MSAA).NumSamples;
    }
    CompressWidth = uVar17;
    uVar10 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar11,uVar15,uVar10);
    local_50 = (ulong)uVar10;
    aVar6 = (pTexInfo->Flags).Gpu;
    if (pTexInfo->MaxLod == 0 && ((ulong)aVar6 & 0x20000440) == 0) {
      (pTexInfo->Alignment).ArraySpacingSingleLod = '\x01';
    }
    else {
      if (((ulong)aVar6 & 0x20000040) == 0) {
        uVar10 = 1;
      }
      else {
        uVar10 = (pTexInfo->MSAA).NumSamples;
      }
      uVar11 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar11 >> 1,uVar15,uVar10);
      local_50 = (ulong)((int)local_50 + uVar15 * 0xc + uVar11);
    }
    if (local_31 == '\0') {
      uVar16 = (uint)local_50 >> ((byte)((uint)*(undefined4 *)&(pTexInfo->Flags).Gpu >> 0x1d) & 1);
    }
    else {
      uVar16 = (uint)(local_50 / local_60);
    }
    uVar16 = uVar16 * CompressWidth;
  }
  uVar17 = local_38;
  local_50 = (ulong)uVar16;
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar11 = 1;
  }
  else {
    uVar11 = (pTexInfo->MSAA).NumSamples;
  }
  uVar11 = GmmTextureCalc::ExpandWidth
                     (&this->super_GmmTextureCalc,local_38,(uint32_t)local_48,uVar11);
  uVar16 = uVar11;
  if (1 < pTexInfo->MaxLod) {
    uVar10 = 1;
    uVar15 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar15 = (pTexInfo->MSAA).NumSamples;
    }
    uVar15 = GmmTextureCalc::ExpandWidth
                       (&this->super_GmmTextureCalc,uVar17 >> 1,(uint32_t)local_48,uVar15);
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar10 = (pTexInfo->MSAA).NumSamples;
    }
    uVar10 = GmmTextureCalc::ExpandWidth
                       (&this->super_GmmTextureCalc,local_38 >> 2,(uint32_t)local_48,uVar10);
    uVar16 = uVar10 + uVar15;
    if (uVar10 + uVar15 < uVar11) {
      uVar16 = uVar11;
    }
  }
  pGVar8 = local_68;
  if (local_31 == '\0') {
    aVar6 = (pTexInfo->Flags).Gpu;
    if ((aVar6._0_4_ >> 0x1d & 1) == 0) {
      if (((ulong)aVar6 & 8) == 0) {
        if (((ulong)aVar6 & 0x10) != 0) {
          uVar16 = (uVar16 * pTexInfo->ArraySize) / 3;
        }
      }
      else {
        uVar16 = uVar16 * pTexInfo->ArraySize >> 2;
      }
    }
    else {
      uVar16 = uVar16 * 2;
    }
  }
  else {
    uVar16 = uVar16 / local_5c;
  }
  uVar16 = uVar16 * CompressHeight >> 3;
  if (uVar16 <= _ColFactor->MinPitch) {
    uVar16 = _ColFactor->MinPitch;
  }
  uVar16 = -_ColFactor->PitchAlignment & (_ColFactor->PitchAlignment - 1) + uVar16;
  local_48 = (ulong)uVar16 | local_50 << 0x20;
  if (local_68->TileInfo[pTexInfo->TileMode].LogicalSize == 0) {
    uStack_40 = 0;
  }
  else {
    uVar1 = local_68->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
    uVar3 = local_68->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    aVar7 = (pTexInfo->Flags).Info;
    local_48 = CONCAT44(-uVar3 & (int)local_50 + uVar3 + -1,-uVar1 & uVar16 + uVar1 + -1);
    uStack_40 = 0;
    if (((ulong)aVar7 >> 0x24 & 1) != 0 &&
        (((ulong)aVar7 & 0x8000000) != 0 || ((ulong)(pTexInfo->Flags).Gpu & 0x800000000) != 0)) {
      local_78 = 0;
      CompressDepth = 0;
      GmmTextureCalc::GmmGetD3DToHwTileConversion
                (&this->super_GmmTextureCalc,pTexInfo,&local_78,&CompressDepth);
      uVar2 = pGVar8->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
      uVar4 = pGVar8->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      auVar18._4_4_ = uVar4;
      auVar18._0_4_ = uVar2;
      auVar18._8_8_ = 0;
      auVar19._4_4_ = CompressDepth;
      auVar19._0_4_ = local_78;
      auVar19._8_8_ = 0;
      auVar18 = pmulld(auVar19,auVar18);
      local_48 = CONCAT44(local_48._4_4_ + auVar18._4_4_ + -1 & -auVar18._4_4_,
                          (uint32_t)local_48 + auVar18._0_4_ + -1 & -auVar18._0_4_);
      uStack_40 = CONCAT44(uStack_40._4_4_ + auVar18._12_4_ + -1 & -auVar18._12_4_,
                           (int)uStack_40 + auVar18._8_4_ + -1 & -auVar18._8_4_);
    }
  }
  (pTexInfo->Flags).Info =
       (anon_struct_8_44_94931171_for_Info)
       ((ulong)(pTexInfo->Flags).Info & 0xfffffffffffd7fff | 0x8000);
  uVar9 = GmmIsYUVPacked(pTexInfo->Format);
  if (((uVar9 != '\0') || (pTexInfo->BitsPerPixel == 0x60)) ||
     (iVar12 = local_48._4_4_, pTexInfo->BitsPerPixel == 0x30)) {
    if ((uint32_t)local_48 == 0) {
      iVar12 = 0x11;
    }
    else {
      iVar12 = ((uint32_t)local_48 + 0xf) / (uint32_t)local_48 + 1;
    }
    iVar12 = local_48._4_4_ + iVar12;
  }
  GVar13 = GmmTextureCalc::FillTexPitchAndSize
                     (&this->super_GmmTextureCalc,pTexInfo,local_48 & 0xffffffff,
                      iVar12 + 1U & 0xfffffffe,_ColFactor);
  if (GVar13 == GMM_SUCCESS) {
    (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[7])(this,pTexInfo);
    (pTexInfo->Alignment).PackedMipStartLod = 0xf;
    GVar13 = GMM_SUCCESS;
  }
  return GVar13;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen7TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) * // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil) ?
     1 :
     pTexInfo->MSAA.NumSamples); // Gen7 MSAA (non-Depth/Stencil) RT samples stored as array planes.

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = 0;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = 0;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    /////////////////////////////////
    // Calculate Block Surface Height
    /////////////////////////////////

    // Adjust total height for arrayed 2D textures
    if(ExpandedArraySize > 1)
    {
        uint32_t Height0, Height1;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);

        // If not ARYSPC_LOD0-eligible...
        if((pTexInfo->MaxLod > 0) ||
           pTexInfo->Flags.Gpu.Depth || // Depth/HiZ/Stencil buffers not ARYSPC_LOD0-compatible.
           pTexInfo->Flags.Gpu.HiZ ||
           pTexInfo->Flags.Gpu.SeparateStencil)
        {
            Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

            // QPitch = (h0 + h1 + 12j) * pitch
            BlockHeight = Height0 + Height1 + 12 * VAlign;
        }
        else // SURFACE_STATE: Surface Array Spacing: ARYSPC_LOD0
        {
            // QPitch = h0 * pitch
            BlockHeight                               = Height0;
            pTexInfo->Alignment.ArraySpacingSingleLod = true;
        }

        if(Compress)
        {
            BlockHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            BlockHeight /= 2;
        }

        // Compute total array height
        BlockHeight *= ExpandedArraySize;
    }
    else
    {
        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }


    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths are greater
    // than LOD0.  e.g. dimensions 4x4 and MinPitch == 1
    if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);

        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth /= CompressWidth;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);


    ////////////////////
    // Adjust for Tiling
    ////////////////////
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // If Tiled Resource or Undefined64KBSwizzle resource, align to 64KB tile size
        if((pTexInfo->Flags.Gpu.TiledResource || pTexInfo->Flags.Info.Undefined64KBSwizzle) &&
           (pTexInfo->Flags.Info.TiledY))
        {
            uint32_t ColFactor = 0, RowFactor = 0;
            uint32_t TRTileWidth = 0, TRTileHeight = 0;

            GmmGetD3DToHwTileConversion(pTexInfo, &ColFactor, &RowFactor);
            TRTileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * ColFactor;
            TRTileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight * RowFactor;

            Pitch       = GFX_ALIGN(Pitch, TRTileWidth);
            BlockHeight = GFX_ALIGN(BlockHeight, TRTileHeight);
        }
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over - fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);

        // Init to no-packed mips. It'll be initialized when app calls to get packed
        // mips. Calculate packed mips here if there's a chance apps won't call to
        // get packed mips.
        pTexInfo->Alignment.PackedMipStartLod = GMM_TILED_RESOURCE_NO_PACKED_MIPS;
    }

    GMM_DPF_EXIT;
    return (Status);
}